

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

NAMED * lookup(XML_Parser parser,HASH_TABLE *table,KEY name,size_t createSize)

{
  byte bVar1;
  XML_Bool XVar2;
  byte bVar3;
  size_t __n;
  NAMED **ppNVar4;
  unsigned_long uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long uVar9;
  NAMED *pNVar10;
  ulong local_88;
  size_t j;
  unsigned_long newHash;
  NAMED **newV;
  size_t tsize_1;
  unsigned_long newMask;
  size_t newSize;
  uchar newPower;
  uchar step;
  unsigned_long mask;
  unsigned_long h;
  size_t tsize;
  size_t i;
  size_t createSize_local;
  KEY name_local;
  HASH_TABLE *table_local;
  XML_Parser parser_local;
  
  if (table->size == 0) {
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    table->power = '\x06';
    table->size = 0x40;
    __n = table->size << 3;
    ppNVar4 = (NAMED **)(*table->mem->malloc_fcn)(__n);
    table->v = ppNVar4;
    if (table->v == (NAMED **)0x0) {
      table->size = 0;
      return (NAMED *)0x0;
    }
    memset(table->v,0,__n);
    uVar5 = hash(parser,name);
    tsize = uVar5 & table->size - 1;
  }
  else {
    uVar5 = hash(parser,name);
    uVar6 = table->size - 1;
    newSize._7_1_ = 0;
    for (tsize = uVar5 & uVar6; table->v[tsize] != (NAMED *)0x0; tsize = lVar7 + tsize) {
      XVar2 = keyeq(name,table->v[tsize]->name);
      if (XVar2 != '\0') {
        return table->v[tsize];
      }
      if (newSize._7_1_ == 0) {
        newSize._7_1_ =
             (byte)((uVar5 & (uVar6 ^ 0xffffffffffffffff)) >> (table->power - 1 & 0x3f)) &
             (byte)(uVar6 >> 2) | 1;
      }
      if (tsize < newSize._7_1_) {
        lVar7 = table->size - (ulong)newSize._7_1_;
      }
      else {
        lVar7 = -(ulong)newSize._7_1_;
      }
    }
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    if (table->used >> (table->power - 1 & 0x3f) != 0) {
      bVar1 = table->power;
      bVar3 = bVar1 + 1;
      if (0x3f < bVar3) {
        return (NAMED *)0x0;
      }
      uVar6 = 1L << (bVar3 & 0x3f);
      uVar8 = uVar6 - 1;
      if (0x1fffffffffffffff < uVar6) {
        return (NAMED *)0x0;
      }
      ppNVar4 = (NAMED **)(*table->mem->malloc_fcn)(uVar6 << 3);
      if (ppNVar4 == (NAMED **)0x0) {
        return (NAMED *)0x0;
      }
      memset(ppNVar4,0,uVar6 << 3);
      for (tsize = 0; tsize < table->size; tsize = tsize + 1) {
        if (table->v[tsize] != (NAMED *)0x0) {
          uVar9 = hash(parser,table->v[tsize]->name);
          newSize._7_1_ = 0;
          for (local_88 = uVar9 & uVar8; ppNVar4[local_88] != (NAMED *)0x0;
              local_88 = lVar7 + local_88) {
            if (newSize._7_1_ == 0) {
              newSize._7_1_ =
                   (byte)((uVar9 & (uVar8 ^ 0xffffffffffffffff)) >> (bVar1 & 0x3f)) &
                   (byte)(uVar8 >> 2) | 1;
            }
            if (local_88 < newSize._7_1_) {
              lVar7 = uVar6 - newSize._7_1_;
            }
            else {
              lVar7 = -(ulong)newSize._7_1_;
            }
          }
          ppNVar4[local_88] = table->v[tsize];
        }
      }
      (*table->mem->free_fcn)(table->v);
      table->v = ppNVar4;
      table->power = bVar3;
      table->size = uVar6;
      newSize._7_1_ = 0;
      for (tsize = uVar5 & uVar8; table->v[tsize] != (NAMED *)0x0; tsize = lVar7 + tsize) {
        if (newSize._7_1_ == 0) {
          newSize._7_1_ =
               (byte)((uVar5 & (uVar8 ^ 0xffffffffffffffff)) >> (bVar1 & 0x3f)) & (byte)(uVar8 >> 2)
               | 1;
        }
        if (tsize < newSize._7_1_) {
          lVar7 = uVar6 - newSize._7_1_;
        }
        else {
          lVar7 = -(ulong)newSize._7_1_;
        }
      }
    }
  }
  pNVar10 = (NAMED *)(*table->mem->malloc_fcn)(createSize);
  table->v[tsize] = pNVar10;
  if (table->v[tsize] == (NAMED *)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    memset(table->v[tsize],0,createSize);
    table->v[tsize]->name = name;
    table->used = table->used + 1;
    parser_local = (XML_Parser)table->v[tsize];
  }
  return (NAMED *)parser_local;
}

Assistant:

static NAMED *
lookup(XML_Parser parser, HASH_TABLE *table, KEY name, size_t createSize) {
  size_t i;
  if (table->size == 0) {
    size_t tsize;
    if (! createSize)
      return NULL;
    table->power = INIT_POWER;
    /* table->size is a power of 2 */
    table->size = (size_t)1 << INIT_POWER;
    tsize = table->size * sizeof(NAMED *);
    table->v = table->mem->malloc_fcn(tsize);
    if (! table->v) {
      table->size = 0;
      return NULL;
    }
    memset(table->v, 0, tsize);
    i = hash(parser, name) & ((unsigned long)table->size - 1);
  } else {
    unsigned long h = hash(parser, name);
    unsigned long mask = (unsigned long)table->size - 1;
    unsigned char step = 0;
    i = h & mask;
    while (table->v[i]) {
      if (keyeq(name, table->v[i]->name))
        return table->v[i];
      if (! step)
        step = PROBE_STEP(h, mask, table->power);
      i < step ? (i += table->size - step) : (i -= step);
    }
    if (! createSize)
      return NULL;

    /* check for overflow (table is half full) */
    if (table->used >> (table->power - 1)) {
      unsigned char newPower = table->power + 1;

      /* Detect and prevent invalid shift */
      if (newPower >= sizeof(unsigned long) * 8 /* bits per byte */) {
        return NULL;
      }

      size_t newSize = (size_t)1 << newPower;
      unsigned long newMask = (unsigned long)newSize - 1;

      /* Detect and prevent integer overflow */
      if (newSize > (size_t)(-1) / sizeof(NAMED *)) {
        return NULL;
      }

      size_t tsize = newSize * sizeof(NAMED *);
      NAMED **newV = table->mem->malloc_fcn(tsize);
      if (! newV)
        return NULL;
      memset(newV, 0, tsize);
      for (i = 0; i < table->size; i++)
        if (table->v[i]) {
          unsigned long newHash = hash(parser, table->v[i]->name);
          size_t j = newHash & newMask;
          step = 0;
          while (newV[j]) {
            if (! step)
              step = PROBE_STEP(newHash, newMask, newPower);
            j < step ? (j += newSize - step) : (j -= step);
          }
          newV[j] = table->v[i];
        }
      table->mem->free_fcn(table->v);
      table->v = newV;
      table->power = newPower;
      table->size = newSize;
      i = h & newMask;
      step = 0;
      while (table->v[i]) {
        if (! step)
          step = PROBE_STEP(h, newMask, newPower);
        i < step ? (i += newSize - step) : (i -= step);
      }
    }
  }
  table->v[i] = table->mem->malloc_fcn(createSize);
  if (! table->v[i])
    return NULL;
  memset(table->v[i], 0, createSize);
  table->v[i]->name = name;
  (table->used)++;
  return table->v[i];
}